

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_a3d2::ARTKeyEncodeDecodeTest_Int32C00010_Test::
~ARTKeyEncodeDecodeTest_Int32C00010_Test(ARTKeyEncodeDecodeTest_Int32C00010_Test *this)

{
  ARTKeyEncodeDecodeTest_Int32C00010_Test *this_local;
  
  ~ARTKeyEncodeDecodeTest_Int32C00010_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TEST(ARTKeyEncodeDecodeTest, Int32C00010) {
  using T = std::int32_t;
  constexpr auto one = 1;  // useless cast:: static_cast<T>(1);
  // Check the encoder byte order.
  constexpr std::array<const std::byte, sizeof(T)> ikey{
      static_cast<std::byte>(0x81), static_cast<std::byte>(0x02),
      static_cast<std::byte>(0x03), static_cast<std::byte>(0x04)};
  do_encode_decode_test(static_cast<T>(0x01020304LL), ikey);
  // round-trip tests.
  //
  // Note: 0, 1, ~0, etc. are already std::int32_t.  If that is not
  // true universally, then we need conditional compilation here to
  // avoid "warning useless cast" errors in the compiler.
  do_encode_decode_test(0);
  do_encode_decode_test(0 + 1);
  do_encode_decode_test(0 - 1);
  do_encode_decode_test(std::numeric_limits<T>::min());
  do_encode_decode_test(std::numeric_limits<T>::min() + one);
  do_encode_decode_test(std::numeric_limits<T>::max());
  do_encode_decode_test(std::numeric_limits<T>::max() - one);
  // check lexicographic ordering for std::uint32_t pairs.
  do_encode_decode_lt_test(0, 1);
  do_encode_decode_lt_test(5, 7);
  do_encode_decode_lt_test(std::numeric_limits<T>::min(),
                           std::numeric_limits<T>::min() + one);
  do_encode_decode_lt_test(std::numeric_limits<T>::max() - one,
                           std::numeric_limits<T>::max());
}